

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O1

void __thiscall dh::symTab::symTab(symTab *this,string *in_function)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  value_type local_48;
  
  (this->container).
  super__Vector_base<std::shared_ptr<dh::symTabElem>,_std::allocator<std::shared_ptr<dh::symTabElem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->container).
  super__Vector_base<std::shared_ptr<dh::symTabElem>,_std::allocator<std::shared_ptr<dh::symTabElem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->donw_tabs).
  super__Vector_base<std::shared_ptr<dh::symTab>,_std::allocator<std::shared_ptr<dh::symTab>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->container).
  super__Vector_base<std::shared_ptr<dh::symTabElem>,_std::allocator<std::shared_ptr<dh::symTabElem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->donw_tabs).
  super__Vector_base<std::shared_ptr<dh::symTab>,_std::allocator<std::shared_ptr<dh::symTab>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->donw_tabs).
  super__Vector_base<std::shared_ptr<dh::symTab>,_std::allocator<std::shared_ptr<dh::symTab>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->in_function)._M_dataplus._M_p = (pointer)&(this->in_function).field_2;
  (this->in_function)._M_string_length = 0;
  (this->in_function).field_2._M_local_buf[0] = '\0';
  local_48.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<dh::symTabElem>,_std::allocator<std::shared_ptr<dh::symTabElem>_>_>::
  resize(&this->container,0x100,&local_48);
  if (local_48.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this_00 = (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::__cxx11::string::_M_assign((string *)&this->in_function);
  this->totaloffset = 0;
  return;
}

Assistant:

symTab::symTab( ::std::string in_function)
{
	this->container.resize(256,nullptr);
	this->upper_tab = nullptr;
	this->in_function = in_function;
	this->totaloffset = 0;
}